

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_renderer.cpp
# Opt level: O3

unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true> __thiscall
duckdb::TreeRenderer::CreateRenderer(TreeRenderer *this,ExplainFormat format)

{
  _func_int **pp_Var1;
  NotImplementedException *this_00;
  undefined *puVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  string local_60;
  string local_40;
  
  uVar3 = CONCAT71(in_register_00000031,format) & 0xffffffff;
  switch(uVar3) {
  case 0:
  case 1:
    pp_Var1 = (_func_int **)operator_new(0x88);
    *(undefined4 *)((long)pp_Var1 + 0x29) = 0;
    *(undefined4 *)((long)pp_Var1 + 0x2c) = 0;
    *pp_Var1 = (_func_int *)&PTR__TreeRenderer_0198e010;
    pp_Var1[1] = (_func_int *)0xf0;
    pp_Var1[2] = (_func_int *)&DAT_0000001d;
    pp_Var1[3] = (_func_int *)0xf;
    pp_Var1[4] = (_func_int *)0x1e;
    *(undefined1 *)(pp_Var1 + 5) = 0;
    pp_Var1[6] = (_func_int *)anon_var_dwarf_21625;
    pp_Var1[7] = (_func_int *)anon_var_dwarf_21639;
    pp_Var1[8] = (_func_int *)anon_var_dwarf_216b5;
    pp_Var1[9] = (_func_int *)anon_var_dwarf_216c9;
    pp_Var1[10] = (_func_int *)anon_var_dwarf_21683;
    pp_Var1[0xb] = (_func_int *)anon_var_dwarf_2162f;
    pp_Var1[0xc] = (_func_int *)anon_var_dwarf_21679;
    pp_Var1[0xd] = (_func_int *)anon_var_dwarf_2168d;
    pp_Var1[0xe] = (_func_int *)anon_var_dwarf_216bf;
    pp_Var1[0xf] = (_func_int *)(anon_var_dwarf_10cd9b6 + 3);
    pp_Var1[0x10] = (_func_int *)anon_var_dwarf_21697;
    goto LAB_00394c3c;
  case 2:
    pp_Var1 = (_func_int **)operator_new(8);
    puVar2 = &JSONTreeRenderer::vtable;
    break;
  case 3:
    pp_Var1 = (_func_int **)operator_new(8);
    puVar2 = &HTMLTreeRenderer::vtable;
    break;
  case 4:
    pp_Var1 = (_func_int **)operator_new(8);
    puVar2 = &GRAPHVIZTreeRenderer::vtable;
    break;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"ExplainFormat %s not implemented","");
    EnumUtil::ToString<duckdb::ExplainFormat>(&local_40,(ExplainFormat)uVar3);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_00,&local_60,&local_40);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  *pp_Var1 = (_func_int *)(puVar2 + 0x10);
LAB_00394c3c:
  this->_vptr_TreeRenderer = pp_Var1;
  return (unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>_>)
         (unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>_>)this;
}

Assistant:

unique_ptr<TreeRenderer> TreeRenderer::CreateRenderer(ExplainFormat format) {
	switch (format) {
	case ExplainFormat::DEFAULT:
	case ExplainFormat::TEXT:
		return make_uniq<TextTreeRenderer>();
	case ExplainFormat::JSON:
		return make_uniq<JSONTreeRenderer>();
	case ExplainFormat::HTML:
		return make_uniq<HTMLTreeRenderer>();
	case ExplainFormat::GRAPHVIZ:
		return make_uniq<GRAPHVIZTreeRenderer>();
	default:
		throw NotImplementedException("ExplainFormat %s not implemented", EnumUtil::ToString(format));
	}
}